

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidLoop3(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *this;
  FeatureType *pFVar2;
  ArrayFeatureType *this_00;
  NeuralNetworkLayer *pNVar3;
  ActivationParams *this_01;
  NeuralNetwork *this_02;
  LoopLayerParams *this_03;
  NeuralNetwork *this_04;
  ostream *poVar4;
  undefined1 local_110 [8];
  Result res;
  NeuralNetworkLayer *l4;
  LoopLayerParams *loop_params;
  NeuralNetworkLayer *l3;
  NeuralNetwork *nnMain;
  NeuralNetworkLayer *l2;
  NeuralNetwork nnBody;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  this = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(this,"A");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(this);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(this);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nnBody._80_8_ = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nnBody._80_8_,"B");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)nnBody._80_8_);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)&l2);
  pNVar3 = CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)&l2);
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar3);
  CoreML::Specification::ActivationParams::mutable_relu(this_01);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar3,"relu");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar3,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar3,"B");
  this_02 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this_02,EXACT_ARRAY_MAPPING);
  pNVar3 = CoreML::Specification::NeuralNetwork::add_layers(this_02);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar3,"for_loop");
  this_03 = CoreML::Specification::NeuralNetworkLayer::mutable_loop(pNVar3);
  this_04 = CoreML::Specification::LoopLayerParams::mutable_bodynetwork(this_03);
  CoreML::Specification::NeuralNetwork::CopyFrom(this_04,(NeuralNetwork *)&l2);
  CoreML::Specification::LoopLayerParams::set_conditionvar(this_03,"cond");
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetwork::add_layers(this_02);
  CoreML::Specification::NeuralNetworkLayer::set_name
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_,"copy");
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_,"B");
  CoreML::Specification::NeuralNetworkLayer::mutable_copy
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_);
  CoreML::validate<(MLModelType)500>((Result *)local_110,(Model *)&topIn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_110);
  if (m._oneof_case_[0]._0_1_) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1209);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((res).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_110);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)&l2);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidLoop3() {
    /*
     condition variable present but no condition network
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();
    
    Specification::NeuralNetwork nnBody;
    
    auto *l2 = nnBody.add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu");
    l2->add_input("A");
    l2->add_output("B");
    
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l3 = nnMain->add_layers();
    l3->set_name("for_loop");
    auto *loop_params = l3->mutable_loop();
    loop_params->mutable_bodynetwork()->CopyFrom(nnBody);
    loop_params->set_conditionvar("cond");
    
    auto *l4 = nnMain->add_layers();
    l4->set_name("copy");
    l4->add_input("A");
    l4->add_output("B");
    (void) l4->mutable_copy();
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}